

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O2

void duckdb::
     HistogramFinalizeFunction<duckdb::HistogramStringFunctor,duckdb::string_t,duckdb::StringMapType<duckdb::OwningStringMap<unsigned_long,std::unordered_map<duckdb::string_t,unsigned_long,duckdb::StringHash,duckdb::StringEquality,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  long *plVar1;
  long lVar2;
  Vector *result_00;
  undefined8 uVar3;
  long lVar4;
  ulong uVar5;
  idx_t iVar6;
  idx_t iVar7;
  idx_t i_1;
  ulong uVar8;
  long lVar9;
  long lVar10;
  idx_t offset_00;
  long *plVar11;
  string_t value;
  UnifiedVectorFormat sdata;
  long *local_78;
  long local_70;
  
  offset_00 = offset;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  FlatVector::VerifyFlatVector(result);
  result_00 = (Vector *)duckdb::ListVector::GetListSize(result);
  lVar9 = 0;
  for (iVar6 = 0; count != iVar6; iVar6 = iVar6 + 1) {
    iVar7 = iVar6;
    if (*local_78 != 0) {
      iVar7 = (idx_t)*(uint *)(*local_78 + iVar6 * 4);
    }
    lVar4 = **(long **)(local_70 + iVar7 * 8);
    if (lVar4 != 0) {
      lVar9 = lVar9 + *(long *)(lVar4 + 0x20);
    }
  }
  duckdb::ListVector::Reserve(result,(ulong)(result_00 + lVar9));
  uVar3 = duckdb::MapVector::GetKeys(result);
  lVar4 = duckdb::MapVector::GetValues(result);
  lVar9 = *(long *)(result + 0x20);
  lVar4 = *(long *)(lVar4 + 0x20);
  for (uVar8 = 0; uVar8 != count; uVar8 = uVar8 + 1) {
    uVar5 = uVar8;
    if (*local_78 != 0) {
      uVar5 = (ulong)*(uint *)(*local_78 + uVar8 * 4);
    }
    lVar2 = **(long **)(local_70 + uVar5 * 8);
    if (lVar2 == 0) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),uVar8 + offset);
    }
    else {
      lVar10 = (uVar8 + offset) * 0x10;
      plVar1 = (long *)(lVar9 + lVar10);
      *(Vector **)(lVar9 + lVar10) = result_00;
      plVar11 = (long *)(lVar2 + 0x18);
      while (plVar11 = (long *)*plVar11, plVar11 != (long *)0x0) {
        value.value.pointer.ptr = (char *)uVar3;
        value.value._0_8_ = plVar11[2];
        HistogramStringFunctor::HistogramFinalize<duckdb::string_t>
                  ((HistogramStringFunctor *)plVar11[1],value,result_00,offset_00);
        *(long *)(lVar4 + (long)result_00 * 8) = plVar11[3];
        result_00 = result_00 + 1;
      }
      plVar1[1] = (long)result_00 - *plVar1;
    }
  }
  duckdb::ListVector::SetListSize(result,(ulong)result_00);
  duckdb::Vector::Verify((ulong)result);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  return;
}

Assistant:

static void HistogramFinalizeFunction(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count,
                                      idx_t offset) {
	using HIST_STATE = HistogramAggState<T, typename MAP_TYPE::MAP_TYPE>;

	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	auto states = UnifiedVectorFormat::GetData<HIST_STATE *>(sdata);

	auto &mask = FlatVector::Validity(result);
	auto old_len = ListVector::GetListSize(result);
	idx_t new_entries = 0;
	// figure out how much space we need
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			continue;
		}
		new_entries += state.hist->size();
	}
	// reserve space in the list vector
	ListVector::Reserve(result, old_len + new_entries);
	auto &keys = MapVector::GetKeys(result);
	auto &values = MapVector::GetValues(result);
	auto list_entries = FlatVector::GetData<list_entry_t>(result);
	auto count_entries = FlatVector::GetData<uint64_t>(values);

	idx_t current_offset = old_len;
	for (idx_t i = 0; i < count; i++) {
		const auto rid = i + offset;
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			mask.SetInvalid(rid);
			continue;
		}

		auto &list_entry = list_entries[rid];
		list_entry.offset = current_offset;
		for (auto &entry : *state.hist) {
			OP::template HistogramFinalize<T>(entry.first, keys, current_offset);
			count_entries[current_offset] = entry.second;
			current_offset++;
		}
		list_entry.length = current_offset - list_entry.offset;
	}
	D_ASSERT(current_offset == old_len + new_entries);
	ListVector::SetListSize(result, current_offset);
	result.Verify(count);
}